

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O2

void helper_gvec_shr32v_sparc64(void *d,void *a,void *b,uint32_t desc)

{
  ulong oprsz;
  ulong uVar1;
  
  oprsz = (ulong)((desc & 0x1f) * 8 + 8);
  for (uVar1 = 0; uVar1 < oprsz; uVar1 = uVar1 + 4) {
    *(uint *)((long)d + uVar1) = *(uint *)((long)a + uVar1) >> (*(byte *)((long)b + uVar1) & 0x1f);
  }
  clear_high(d,oprsz,desc);
  return;
}

Assistant:

void HELPER(gvec_shr32v)(void *d, void *a, void *b, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(uint32_t)) {
        uint8_t sh = *(uint32_t *)((char *)b + i) & 31;
        *(uint32_t *)((char *)d + i) = *(uint32_t *)((char *)a + i) >> sh;
    }
    clear_high(d, oprsz, desc);
}